

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

void Assimp::FindSceneCenter(aiScene *scene,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  aiVector3D local_68;
  aiVector3D local_58;
  aiVector3D *local_48;
  aiVector3D local_3c;
  
  if ((scene != (aiScene *)0x0) && (scene->mNumMeshes != 0)) {
    FindMeshCenter(*scene->mMeshes,out,min,max);
    local_48 = out;
    if (scene->mNumMeshes < 2) {
      uVar5._0_4_ = max->x;
      uVar5._4_4_ = max->y;
      fVar6 = max->z;
    }
    else {
      uVar3 = 1;
      do {
        local_58.x = 0.0;
        local_58.y = 0.0;
        local_58.z = 0.0;
        local_68.x = 0.0;
        local_68.y = 0.0;
        local_68.z = 0.0;
        FindMeshCenter(scene->mMeshes[uVar3],&local_3c,&local_58,&local_68);
        if (local_58.x < min->x) {
          min->x = local_58.x;
        }
        if (local_58.y < min->y) {
          min->y = local_58.y;
        }
        if (local_58.z < min->z) {
          min->z = local_58.z;
        }
        fVar4 = max->x;
        if (max->x < local_68.x) {
          max->x = local_68.x;
          fVar4 = local_68.x;
        }
        fVar7 = max->y;
        if (max->y < local_68.y) {
          max->y = local_68.y;
          fVar7 = local_68.y;
        }
        fVar6 = max->z;
        if (max->z < local_68.z) {
          max->z = local_68.z;
          fVar6 = local_68.z;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < scene->mNumMeshes);
      uVar5 = CONCAT44(fVar7,fVar4);
    }
    fVar4 = min->z;
    uVar1 = min->x;
    uVar2 = min->y;
    local_48->x = ((float)uVar5 - (float)uVar1) * 0.5 + (float)uVar1;
    local_48->y = ((float)((ulong)uVar5 >> 0x20) - (float)uVar2) * 0.5 + (float)uVar2;
    local_48->z = (fVar6 - fVar4) * 0.5 + fVar4;
  }
  return;
}

Assistant:

void FindSceneCenter (aiScene* scene, aiVector3D& out, aiVector3D& min, aiVector3D& max) {
    if ( NULL == scene ) {
        return;
    }

    if ( 0 == scene->mNumMeshes ) {
        return;
    }
    FindMeshCenter(scene->mMeshes[0], out, min, max);
    for (unsigned int i = 1; i < scene->mNumMeshes; ++i) {
        aiVector3D tout, tmin, tmax;
        FindMeshCenter(scene->mMeshes[i], tout, tmin, tmax);
        if (min[0] > tmin[0]) min[0] = tmin[0];
        if (min[1] > tmin[1]) min[1] = tmin[1];
        if (min[2] > tmin[2]) min[2] = tmin[2];
        if (max[0] < tmax[0]) max[0] = tmax[0];
        if (max[1] < tmax[1]) max[1] = tmax[1];
        if (max[2] < tmax[2]) max[2] = tmax[2];
    }
    out = min + (max-min)*(ai_real)0.5;
}